

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::VertexInputInstance::writeVertexInputData
               (deUint8 *destPtr,VkVertexInputBindingDescription *bindingDescription,
               VkDeviceSize bindingOffset,AttributeDescriptionList *attributes)

{
  uint uVar1;
  VertexInputAttributeDescription *pVVar2;
  const_reference attribute;
  VertexInputAttributeDescription *attribDesc;
  size_t attributeNdx;
  deUint8 *pdStack_38;
  deUint32 vertexNdx;
  deUint8 *destOffsetPtr;
  deUint32 vertexCount;
  AttributeDescriptionList *attributes_local;
  VkDeviceSize bindingOffset_local;
  VkVertexInputBindingDescription *bindingDescription_local;
  deUint8 *destPtr_local;
  
  uVar1 = 2;
  if (bindingDescription->inputRate == VK_VERTEX_INPUT_RATE_VERTEX) {
    uVar1 = 8;
  }
  pdStack_38 = destPtr + bindingOffset;
  for (attributeNdx._4_4_ = 0; attributeNdx._4_4_ < uVar1;
      attributeNdx._4_4_ = attributeNdx._4_4_ + 1) {
    attribDesc = (VertexInputAttributeDescription *)0x0;
    while( true ) {
      pVVar2 = (VertexInputAttributeDescription *)
               std::
               vector<vkt::pipeline::(anonymous_namespace)::VertexInputInstance::VertexInputAttributeDescription,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputInstance::VertexInputAttributeDescription>_>
               ::size(attributes);
      if (pVVar2 <= attribDesc) break;
      attribute = std::
                  vector<vkt::pipeline::(anonymous_namespace)::VertexInputInstance::VertexInputAttributeDescription,_std::allocator<vkt::pipeline::(anonymous_namespace)::VertexInputInstance::VertexInputAttributeDescription>_>
                  ::operator[](attributes,(size_type)attribDesc);
      if ((attribute->vkDescription).binding == bindingDescription->binding) {
        writeVertexInputValue
                  (pdStack_38 + (attribute->vkDescription).offset,attribute,attributeNdx._4_4_);
      }
      attribDesc = (VertexInputAttributeDescription *)((long)&attribDesc->glslType + 1);
    }
    pdStack_38 = pdStack_38 + bindingDescription->stride;
  }
  return;
}

Assistant:

void VertexInputInstance::writeVertexInputData(deUint8* destPtr, const VkVertexInputBindingDescription& bindingDescription, const VkDeviceSize bindingOffset, const AttributeDescriptionList& attributes)
{
	const deUint32 vertexCount = (bindingDescription.inputRate == VK_VERTEX_INPUT_RATE_VERTEX) ? (4 * 2) : 2;

	deUint8* destOffsetPtr = ((deUint8 *)destPtr) + bindingOffset;
	for (deUint32 vertexNdx = 0; vertexNdx < vertexCount; vertexNdx++)
	{
		for (size_t attributeNdx = 0; attributeNdx < attributes.size(); attributeNdx++)
		{
			const VertexInputAttributeDescription& attribDesc = attributes[attributeNdx];

			// Only write vertex input data to bindings referenced by attribute descriptions
			if (attribDesc.vkDescription.binding == bindingDescription.binding)
			{
				writeVertexInputValue(destOffsetPtr + attribDesc.vkDescription.offset, attribDesc, vertexNdx);
			}
		}
		destOffsetPtr += bindingDescription.stride;
	}
}